

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTextureCubeInt(GatherBase *this)

{
  CallLogWrapper *pCVar1;
  GLenum target;
  int internalformat;
  ulong uVar2;
  int i_1;
  long lVar3;
  int i;
  int level;
  ulong uVar4;
  GLenum type;
  allocator_type local_a5;
  int local_a4;
  ulong local_a0;
  CallLogWrapper *local_98;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  IVec4 data [4];
  
  local_a4 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])(data,this);
  level = 0;
  lVar3 = std::__cxx11::string::find((char)data,0x75);
  if ((IVec4 *)data[0].m_data._0_8_ != data + 1) {
    operator_delete((void *)data[0].m_data._0_8_,data[1].m_data._0_8_ + 1);
  }
  local_a0 = (ulong)(lVar3 == -1 ^ 0x1405);
  pCVar1 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(pCVar1,1,&this->tex);
  local_98 = pCVar1;
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8513,this->tex);
  pCVar1 = local_98;
  uVar2 = local_a0;
  internalformat = local_a4;
  uVar4 = 0x20;
  do {
    lVar3 = 0;
    do {
      glu::CallLogWrapper::glTexImage2D
                (pCVar1,*(GLenum *)((long)&DAT_01b39d00 + lVar3),level,internalformat,(GLsizei)uVar4
                 ,(GLsizei)uVar4,0,0x8d99,(GLenum)uVar2,(void *)0x0);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x18);
    level = level + 1;
    uVar4 = uVar4 >> 1;
  } while (level != 6);
  lVar3 = 0;
  do {
    data[0].m_data[lVar3] = 999;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&pixels,0x400,data,&local_a5);
  pCVar1 = local_98;
  uVar4 = local_a0;
  lVar3 = 0;
  do {
    type = (GLenum)uVar4;
    glu::CallLogWrapper::glTexSubImage2D
              (pCVar1,*(GLenum *)((long)&DAT_01b39d00 + lVar3),0,0,0,0x20,0x20,0x8d99,type,
               pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  data[0].m_data[0] = 0xc;
  data[0].m_data[1] = 0xd;
  data[0].m_data[2] = 0xe;
  data[0].m_data[3] = 0xf;
  data[1].m_data[0] = 8;
  data[1].m_data[1] = 9;
  data[1].m_data[2] = 10;
  data[1].m_data[3] = 0xb;
  data[2].m_data[0] = 0;
  data[2].m_data[1] = 1;
  data[2].m_data[2] = 2;
  data[2].m_data[3] = 3;
  data[3].m_data[0] = 4;
  data[3].m_data[1] = 5;
  data[3].m_data[2] = 6;
  data[3].m_data[3] = 7;
  lVar3 = 0;
  do {
    target = *(GLenum *)((long)&DAT_01b39d00 + lVar3);
    glu::CallLogWrapper::glTexSubImage2D(pCVar1,target,0,0x16,0x19,2,2,0x8d99,type,data);
    glu::CallLogWrapper::glTexSubImage2D(pCVar1,target,0,0x10,10,1,1,0x8d99,type,data);
    glu::CallLogWrapper::glTexSubImage2D(pCVar1,target,0,0xb,2,1,1,0x8d99,type,data + 1);
    glu::CallLogWrapper::glTexSubImage2D(pCVar1,target,0,0x18,0xd,1,1,0x8d99,type,data + 2);
    glu::CallLogWrapper::glTexSubImage2D(pCVar1,target,0,9,0xe,1,1,0x8d99,type,data + 3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2800,0x2600);
  if (pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pixels.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual GLvoid CreateTextureCubeInt()
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		tex_type		= Type().find('u') != std::string::npos ? GL_UNSIGNED_INT : GL_INT;

		const GLenum faces[6] = { GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z };

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			for (int j = 0; j < 6; ++j)
			{
				glTexImage2D(faces[j], i, internal_format, size, size, 0, GL_RGBA_INTEGER, tex_type, 0);
			}
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		for (int j = 0; j < 6; ++j)
		{
			glTexSubImage2D(faces[j], 0, 0, 0, csize, csize, GL_RGBA_INTEGER, tex_type, &pixels[0]);
		}

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		for (int j = 0; j < 6; ++j)
		{
			glTexSubImage2D(faces[j], 0, 22, 25, 2, 2, GL_RGBA_INTEGER, tex_type, data);
			glTexSubImage2D(faces[j], 0, 16, 10, 1, 1, GL_RGBA_INTEGER, tex_type, data + 0);
			glTexSubImage2D(faces[j], 0, 11, 2, 1, 1, GL_RGBA_INTEGER, tex_type, data + 1);
			glTexSubImage2D(faces[j], 0, 24, 13, 1, 1, GL_RGBA_INTEGER, tex_type, data + 2);
			glTexSubImage2D(faces[j], 0, 9, 14, 1, 1, GL_RGBA_INTEGER, tex_type, data + 3);
		}

		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}